

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O1

int ED::RetrieveChainNos(Chain *chains,int root,int *chainNos)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  while (root != -1) {
    chainNos[lVar2] = root;
    iVar1 = chains[root].children[0];
    if (chains[root].children[0] == -1) {
      iVar1 = chains[root].children[1];
    }
    root = iVar1;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2;
}

Assistant:

int ED::RetrieveChainNos(Chain * chains, int root, int chainNos[])
{
	int count = 0;

	while (root != -1) {
		chainNos[count] = root;
		count++;

		if (chains[root].children[0] != -1) root = chains[root].children[0];
		else                                root = chains[root].children[1];
	} //end-while

	return count;
}